

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

bsp_size_t bsp_hpmove(void **tag_ptr,void **payload_ptr)

{
  pointer ppVar1;
  Bsmp *this;
  void *pvVar2;
  bsp_size_t bVar3;
  TicToc t;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_hpmove: can only be called within SPMD section\n");
  }
  bsplib::TicToc::TicToc(&t,BSMP,0);
  if (tag_ptr == (void **)0x0 || payload_ptr == (void **)0x0) {
    bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");
  }
  ppVar1 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((s_bsmp->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar1) {
    bVar3 = -1;
  }
  else {
    t.m_nbytes = t.m_nbytes + ppVar1[-1].second;
    pvVar2 = bsplib::Bsmp::tag(s_bsmp);
    *tag_ptr = pvVar2;
    this = s_bsmp;
    *payload_ptr = (void *)((long)(s_bsmp->m_payload_buffer).m_aligned_ptr +
                           (s_bsmp->m_payloads).
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].first);
    bVar3 = (bsp_size_t)
            (this->m_payloads).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].second;
    bsplib::Bsmp::pop(this);
  }
  bsplib::TicToc::~TicToc(&t);
  return bVar3;
}

Assistant:

bsp_size_t bsp_hpmove( void ** tag_ptr, void ** payload_ptr )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpmove: can only be called within SPMD section\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP );
#endif

     if ( tag_ptr == NULL || payload_ptr == NULL )
        bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");

     if ( s_bsmp->empty() )
         return bsp_size_t(-1);

#ifdef PROFILE
     t.add_bytes( s_bsmp->payload_size() );
#endif

     *tag_ptr = s_bsmp->tag();
     *payload_ptr = s_bsmp->payload();
     size_t size = s_bsmp->payload_size();
     s_bsmp->pop();
     return static_cast<bsp_size_t>( size );
}